

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlreader(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  xmlParserInputBufferPtr pxVar73;
  undefined8 uVar74;
  xmlTextReaderPtr pxVar75;
  xmlDocPtr pxVar76;
  long lVar77;
  xmlNodePtr pxVar78;
  ulong uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  int n_options_3;
  uint uVar82;
  ulong *puVar83;
  undefined4 *puVar84;
  uint *puVar85;
  int n_URI_1;
  uint uVar86;
  ulong in_RSI;
  ulong uVar87;
  char *pcVar88;
  char *pcVar89;
  int n_namespaceURI;
  undefined8 *puVar90;
  int n_options_4;
  int n_options_2;
  uint uVar91;
  int n_URI;
  uint uVar92;
  undefined4 uVar93;
  int test_ret;
  int test_ret_1;
  int test_ret_9;
  int test_ret_18;
  int test_ret_3;
  int test_ret_63;
  int test_ret_4;
  int test_ret_64;
  int test_ret_6;
  int test_ret_5;
  int test_ret_2;
  int local_88;
  int local_7c;
  int local_64;
  int local_54;
  int local_48;
  int local_44;
  
  if (quiet == '\0') {
    puts("Testing xmlreader : 76 of 89 functions ...");
  }
  iVar1 = 0;
  uVar86 = 0;
  do {
    puVar83 = &DAT_00159d80;
    uVar87 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      pxVar73 = gen_xmlParserInputBufferPtr(uVar86,iVar5);
      uVar92 = (uint)uVar87;
      if (uVar92 < 7) {
        in_RSI = *puVar83;
      }
      else {
        in_RSI = 0;
      }
      uVar74 = xmlNewTextReader(pxVar73);
      xmlFreeTextReader(uVar74);
      call_tests = call_tests + 1;
      xmlFreeParserInputBuffer(pxVar73);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextReader",(ulong)(uint)(iVar5 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar86);
        printf(" %d");
        putchar(10);
        in_RSI = uVar87;
      }
      uVar92 = uVar92 + 1;
      uVar87 = (ulong)uVar92;
      puVar83 = puVar83 + 1;
    } while (uVar92 != 8);
    uVar86 = uVar86 + 1;
  } while (uVar86 != 8);
  function_tests = function_tests + 1;
  puVar90 = &DAT_00159d80;
  uVar86 = 0;
  local_7c = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar86 < 7) {
      uVar74 = *puVar90;
    }
    else {
      uVar74 = 0;
    }
    xmlNewTextReaderFilename(uVar74);
    xmlFreeTextReader();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewTextReaderFilename",(ulong)(uint)(iVar5 - iVar4));
      local_7c = local_7c + 1;
      printf(" %d",(ulong)uVar86);
      putchar(10);
    }
    uVar86 = uVar86 + 1;
    puVar90 = puVar90 + 1;
  } while (uVar86 != 8);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar86 = 0;
  do {
    uVar87 = 0;
    do {
      uVar79 = 0;
      do {
        iVar5 = 0;
        do {
          iVar6 = xmlMemBlocks();
          if (uVar86 < 4) {
            uVar74 = (&DAT_00159d60)[uVar86];
          }
          else {
            uVar74 = 0;
          }
          if ((uint)uVar87 < 7) {
            uVar80 = (&DAT_00159d80)[uVar87];
          }
          else {
            uVar80 = 0;
          }
          if ((uint)uVar79 < 3) {
            uVar81 = (&DAT_00159d48)[uVar79];
          }
          else {
            uVar81 = 0;
          }
          xmlReaderForDoc(uVar74,uVar80,uVar81);
          xmlFreeTextReader();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderForDoc",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",(ulong)uVar86);
            printf(" %d",uVar87);
            printf(" %d",uVar79);
            printf(" %d");
            putchar(10);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != 5);
        uVar92 = (uint)uVar79 + 1;
        uVar79 = (ulong)uVar92;
      } while (uVar92 != 4);
      uVar92 = (uint)uVar87 + 1;
      uVar87 = (ulong)uVar92;
    } while (uVar92 != 8);
    uVar86 = uVar86 + 1;
  } while (uVar86 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar86 = 0;
  do {
    uVar87 = 0;
    do {
      uVar92 = 0;
      puVar84 = &DAT_00157244;
      do {
        iVar5 = xmlMemBlocks();
        if (uVar86 < 7) {
          uVar74 = (&DAT_00159d80)[uVar86];
        }
        else {
          uVar74 = 0;
        }
        if ((uint)uVar87 < 3) {
          uVar80 = (&DAT_00159d48)[uVar87];
        }
        else {
          uVar80 = 0;
        }
        uVar93 = 0x200;
        if (uVar92 < 4) {
          uVar93 = *puVar84;
        }
        xmlReaderForFile(uVar74,uVar80,uVar93);
        xmlFreeTextReader();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderForFile",(ulong)(uint)(iVar6 - iVar5));
          local_64 = local_64 + 1;
          printf(" %d",(ulong)uVar86);
          printf(" %d",uVar87);
          printf(" %d");
          putchar(10);
        }
        uVar92 = uVar92 + 1;
        puVar84 = puVar84 + 1;
      } while (uVar92 != 5);
      uVar92 = (uint)uVar87 + 1;
      uVar87 = (ulong)uVar92;
    } while (uVar92 != 4);
    uVar86 = uVar86 + 1;
  } while (uVar86 != 8);
  function_tests = function_tests + 1;
  local_54 = 0;
  iVar5 = 0;
  do {
    uVar86 = 0;
    do {
      uVar87 = 0;
      do {
        uVar79 = 0;
        do {
          pxVar76 = (xmlDocPtr)0x0;
          puVar84 = &DAT_00157244;
          do {
            iVar6 = xmlMemBlocks();
            if (iVar5 == 0) {
              pcVar89 = "foo";
LAB_0013ac08:
              bVar3 = false;
            }
            else {
              if (iVar5 == 2) {
                pcVar89 = "test/ent2";
                goto LAB_0013ac08;
              }
              if (iVar5 == 1) {
                bVar3 = false;
                pcVar89 = "<foo/>";
              }
              else {
                bVar3 = true;
                pcVar89 = (char *)0x0;
              }
            }
            uVar92 = 0xffffffff;
            if (uVar86 < 4) {
              uVar92 = (&DAT_00157254)[uVar86];
            }
            if ((uint)uVar87 < 7) {
              uVar74 = (&DAT_00159d80)[uVar87];
            }
            else {
              uVar74 = 0;
            }
            if ((uint)uVar79 < 3) {
              uVar80 = (&DAT_00159d48)[uVar79];
            }
            else {
              uVar80 = 0;
            }
            uVar93 = 0x200;
            uVar91 = (uint)pxVar76;
            if (uVar91 < 4) {
              uVar93 = *puVar84;
            }
            if ((!bVar3) && (iVar7 = xmlStrlen(pcVar89,uVar79,uVar74), iVar7 < (int)uVar92)) {
              uVar92 = 0;
            }
            pcVar88 = (char *)(ulong)uVar92;
            xmlReaderForMemory(pcVar89,pcVar88,uVar74,uVar80,uVar93);
            xmlFreeTextReader();
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlReaderForMemory",(ulong)(uint)(iVar7 - iVar6));
              local_54 = local_54 + 1;
              printf(" %d",iVar5);
              printf(" %d",(ulong)uVar86);
              printf(" %d",uVar87);
              printf(" %d",uVar79);
              printf(" %d");
              putchar(10);
              pcVar88 = (char *)pxVar76;
            }
            uVar91 = uVar91 + 1;
            pxVar76 = (xmlDocPtr)(ulong)uVar91;
            puVar84 = puVar84 + 1;
          } while (uVar91 != 5);
          uVar92 = (uint)uVar79 + 1;
          uVar79 = (ulong)uVar92;
        } while (uVar92 != 4);
        uVar92 = (uint)uVar87 + 1;
        uVar87 = (ulong)uVar92;
      } while (uVar92 != 8);
      uVar86 = uVar86 + 1;
    } while (uVar86 != 4);
    iVar5 = iVar5 + 1;
    if (iVar5 == 4) {
      function_tests = function_tests + 1;
      local_44 = 0;
      uVar86 = 0;
      do {
        uVar92 = 0;
        do {
          uVar87 = 0;
          do {
            uVar79 = 0;
            do {
              pxVar76 = (xmlDocPtr)0x0;
              puVar84 = &DAT_00157244;
              do {
                iVar6 = (int)pcVar88;
                iVar5 = xmlMemBlocks();
                pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar6);
                if (uVar92 < 4) {
                  pcVar88 = (char *)(&DAT_00159d60)[uVar92];
                }
                else {
                  pcVar88 = (char *)0x0;
                }
                if ((uint)uVar87 < 7) {
                  uVar74 = (&DAT_00159d80)[uVar87];
                }
                else {
                  uVar74 = 0;
                }
                if ((uint)uVar79 < 3) {
                  uVar80 = (&DAT_00159d48)[uVar79];
                }
                else {
                  uVar80 = 0;
                }
                uVar93 = 0x200;
                uVar91 = (uint)pxVar76;
                if (uVar91 < 4) {
                  uVar93 = *puVar84;
                }
                xmlReaderNewDoc(pxVar75,pcVar88,uVar74,uVar80,uVar93);
                call_tests = call_tests + 1;
                if (pxVar75 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar75);
                }
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlReaderNewDoc",(ulong)(uint)(iVar6 - iVar5));
                  local_44 = local_44 + 1;
                  printf(" %d",(ulong)uVar86);
                  printf(" %d",(ulong)uVar92);
                  printf(" %d",uVar87);
                  printf(" %d",uVar79);
                  printf(" %d");
                  putchar(10);
                  pcVar88 = (char *)pxVar76;
                }
                uVar91 = uVar91 + 1;
                pxVar76 = (xmlDocPtr)(ulong)uVar91;
                puVar84 = puVar84 + 1;
              } while (uVar91 != 5);
              uVar91 = (uint)uVar79 + 1;
              uVar79 = (ulong)uVar91;
            } while (uVar91 != 4);
            uVar91 = (uint)uVar87 + 1;
            uVar87 = (ulong)uVar91;
          } while (uVar91 != 8);
          uVar92 = uVar92 + 1;
        } while (uVar92 != 5);
        uVar86 = uVar86 + 1;
      } while (uVar86 != 4);
      iVar1 = local_7c + iVar1 + iVar4 + local_64;
      function_tests = function_tests + 1;
      local_48 = 0;
      uVar86 = 0;
      do {
        uVar92 = 0;
        do {
          uVar87 = 0;
          do {
            puVar84 = &DAT_00157244;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar5 = (int)pcVar88;
              iVar4 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar5);
              if (uVar92 < 7) {
                pcVar88 = (char *)(&DAT_00159d80)[uVar92];
              }
              else {
                pcVar88 = (char *)0x0;
              }
              if ((uint)uVar87 < 3) {
                uVar74 = (&DAT_00159d48)[uVar87];
              }
              else {
                uVar74 = 0;
              }
              uVar93 = 0x200;
              uVar91 = (uint)pxVar76;
              if (uVar91 < 4) {
                uVar93 = *puVar84;
              }
              xmlReaderNewFile(pxVar75,pcVar88,uVar74,uVar93);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderNewFile",(ulong)(uint)(iVar5 - iVar4));
                local_48 = local_48 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d",(ulong)uVar92);
                printf(" %d",uVar87);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar91 = uVar91 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar91;
              puVar84 = puVar84 + 1;
            } while (uVar91 != 5);
            uVar91 = (uint)uVar87 + 1;
            uVar87 = (ulong)uVar91;
          } while (uVar91 != 4);
          uVar92 = uVar92 + 1;
        } while (uVar92 != 8);
        uVar86 = uVar86 + 1;
      } while (uVar86 != 4);
      function_tests = function_tests + 1;
      local_64 = 0;
      uVar86 = 0;
      do {
        iVar4 = 0;
        do {
          uVar87 = 0;
          do {
            uVar79 = 0;
            do {
              uVar92 = 0;
              do {
                uVar91 = 0;
                do {
                  iVar6 = (int)pcVar88;
                  iVar5 = xmlMemBlocks();
                  pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar6);
                  if (iVar4 == 0) {
                    pcVar88 = "foo";
LAB_0013b0ea:
                    bVar3 = false;
                  }
                  else {
                    if (iVar4 == 2) {
                      pcVar88 = "test/ent2";
                      goto LAB_0013b0ea;
                    }
                    if (iVar4 == 1) {
                      bVar3 = false;
                      pcVar88 = "<foo/>";
                    }
                    else {
                      bVar3 = true;
                      pcVar88 = (char *)0x0;
                    }
                  }
                  iVar6 = -1;
                  if ((uint)uVar87 < 4) {
                    iVar6 = (&DAT_00157254)[uVar87];
                  }
                  if ((uint)uVar79 < 7) {
                    uVar74 = (&DAT_00159d80)[uVar79];
                  }
                  else {
                    uVar74 = 0;
                  }
                  if ((!bVar3) && (iVar7 = xmlStrlen(pcVar88), iVar7 < iVar6)) {
                    iVar6 = 0;
                  }
                  xmlReaderNewMemory(pxVar75,pcVar88,iVar6,uVar74);
                  call_tests = call_tests + 1;
                  if (pxVar75 != (xmlTextReaderPtr)0x0) {
                    xmlFreeTextReader(pxVar75);
                  }
                  xmlResetLastError();
                  iVar6 = xmlMemBlocks();
                  if (iVar5 != iVar6) {
                    iVar6 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlReaderNewMemory",
                           (ulong)(uint)(iVar6 - iVar5));
                    local_64 = local_64 + 1;
                    printf(" %d",(ulong)uVar86);
                    printf(" %d",iVar4);
                    printf(" %d",uVar87);
                    printf(" %d",uVar79);
                    printf(" %d",(ulong)uVar92);
                    pcVar88 = (char *)(ulong)uVar91;
                    printf(" %d");
                    putchar(10);
                  }
                  uVar91 = uVar91 + 1;
                } while (uVar91 != 5);
                uVar92 = uVar92 + 1;
              } while (uVar92 != 4);
              uVar92 = (uint)uVar79 + 1;
              uVar79 = (ulong)uVar92;
            } while (uVar92 != 8);
            uVar92 = (uint)uVar87 + 1;
            uVar87 = (ulong)uVar92;
          } while (uVar92 != 4);
          iVar4 = iVar4 + 1;
        } while (iVar4 != 4);
        uVar86 = uVar86 + 1;
        if (uVar86 == 4) {
          function_tests = function_tests + 1;
          iVar4 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            do {
              iVar6 = (int)pcVar88;
              iVar5 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar6);
              pxVar76 = gen_xmlDocPtr(uVar92,iVar6);
              pcVar88 = (char *)pxVar76;
              xmlReaderNewWalker(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              if (((pxVar76 != (xmlDocPtr)0x0) && (api_doc != pxVar76)) && (pxVar76->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar76);
              }
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderNewWalker",(ulong)(uint)(iVar6 - iVar5))
                ;
                iVar4 = iVar4 + 1;
                printf(" %d",(ulong)uVar86);
                pcVar88 = (char *)(ulong)uVar92;
                printf(" %d");
                putchar(10);
              }
              uVar92 = uVar92 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar5 = 0;
          do {
            iVar6 = xmlMemBlocks();
            pxVar76 = gen_xmlDocPtr(uVar86,(int)pcVar88);
            uVar74 = xmlReaderWalker(pxVar76);
            xmlFreeTextReader(uVar74);
            call_tests = call_tests + 1;
            if (((pxVar76 != (xmlDocPtr)0x0) && (api_doc != pxVar76)) && (pxVar76->doc != api_doc))
            {
              xmlFreeDoc(pxVar76);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlReaderWalker",(ulong)(uint)(iVar7 - iVar6));
              iVar5 = iVar5 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar6 = 0;
          do {
            iVar7 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderAttributeCount(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderAttributeCount",
                     (ulong)(uint)(iVar8 - iVar7));
              iVar6 = iVar6 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar7 = 0;
          do {
            iVar8 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderBaseUri(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar9 = xmlMemBlocks();
            if (iVar8 != iVar9) {
              iVar9 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderBaseUri",(ulong)(uint)(iVar9 - iVar8))
              ;
              iVar7 = iVar7 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar8 = 0;
          do {
            iVar9 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderByteConsumed(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar10 = xmlMemBlocks();
            if (iVar9 != iVar10) {
              iVar10 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderByteConsumed",
                     (ulong)(uint)(iVar10 - iVar9));
              iVar8 = iVar8 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar9 = 0;
          do {
            iVar10 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderClose(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar11 = xmlMemBlocks();
            if (iVar10 != iVar11) {
              iVar11 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderClose",(ulong)(uint)(iVar11 - iVar10))
              ;
              iVar9 = iVar9 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar10 = 0;
          do {
            iVar11 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstBaseUri(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar12 = xmlMemBlocks();
            if (iVar11 != iVar12) {
              iVar12 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstBaseUri",
                     (ulong)(uint)(iVar12 - iVar11));
              iVar10 = iVar10 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar11 = 0;
          do {
            iVar12 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstEncoding(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar13 = xmlMemBlocks();
            if (iVar12 != iVar13) {
              iVar13 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstEncoding",
                     (ulong)(uint)(iVar13 - iVar12));
              iVar11 = iVar11 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar12 = 0;
          do {
            iVar13 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstLocalName(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar14 = xmlMemBlocks();
            if (iVar13 != iVar14) {
              iVar14 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstLocalName",
                     (ulong)(uint)(iVar14 - iVar13));
              iVar12 = iVar12 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar13 = 0;
          do {
            iVar14 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstName(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar15 = xmlMemBlocks();
            if (iVar14 != iVar15) {
              iVar15 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstName",
                     (ulong)(uint)(iVar15 - iVar14));
              iVar13 = iVar13 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar14 = 0;
          do {
            iVar15 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstNamespaceUri(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar16 = xmlMemBlocks();
            if (iVar15 != iVar16) {
              iVar16 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstNamespaceUri",
                     (ulong)(uint)(iVar16 - iVar15));
              iVar14 = iVar14 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar15 = 0;
          do {
            iVar16 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstPrefix(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar17 = xmlMemBlocks();
            if (iVar16 != iVar17) {
              iVar17 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstPrefix",
                     (ulong)(uint)(iVar17 - iVar16));
              iVar15 = iVar15 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar16 = 0;
          uVar86 = 0;
          do {
            puVar90 = &DAT_00159d60;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar18 = (int)pcVar88;
              iVar17 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar18);
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              xmlTextReaderConstString(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar18 = xmlMemBlocks();
              if (iVar17 != iVar18) {
                iVar18 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderConstString",
                       (ulong)(uint)(iVar18 - iVar17));
                iVar16 = iVar16 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar17 = 0;
          do {
            iVar18 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstValue(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar19 = xmlMemBlocks();
            if (iVar18 != iVar19) {
              iVar19 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstValue",
                     (ulong)(uint)(iVar19 - iVar18));
              iVar17 = iVar17 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar18 = 0;
          do {
            iVar19 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstXmlLang(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar20 = xmlMemBlocks();
            if (iVar19 != iVar20) {
              iVar20 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstXmlLang",
                     (ulong)(uint)(iVar20 - iVar19));
              iVar18 = iVar18 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar19 = 0;
          do {
            iVar20 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderConstXmlVersion(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar21 = xmlMemBlocks();
            if (iVar20 != iVar21) {
              iVar21 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderConstXmlVersion",
                     (ulong)(uint)(iVar21 - iVar20));
              iVar19 = iVar19 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar20 = 0;
          do {
            iVar21 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            pxVar76 = (xmlDocPtr)xmlTextReaderCurrentDoc(pxVar75);
            if (api_doc != pxVar76) {
              xmlFreeDoc(pxVar76);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar22 = xmlMemBlocks();
            if (iVar21 != iVar22) {
              iVar22 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderCurrentDoc",
                     (ulong)(uint)(iVar22 - iVar21));
              iVar20 = iVar20 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar21 = 0;
          do {
            iVar22 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            pxVar78 = (xmlNodePtr)xmlTextReaderCurrentNode(pxVar75);
            desret_xmlNodePtr(pxVar78);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar23 = xmlMemBlocks();
            if (iVar22 != iVar23) {
              iVar23 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderCurrentNode",
                     (ulong)(uint)(iVar23 - iVar22));
              iVar21 = iVar21 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar22 = 0;
          do {
            iVar23 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderDepth(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar24 = xmlMemBlocks();
            if (iVar23 != iVar24) {
              iVar24 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderDepth",(ulong)(uint)(iVar24 - iVar23))
              ;
              iVar22 = iVar22 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar23 = 0;
          do {
            iVar24 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            pxVar78 = (xmlNodePtr)xmlTextReaderExpand(pxVar75);
            desret_xmlNodePtr(pxVar78);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar25 = xmlMemBlocks();
            if (iVar24 != iVar25) {
              iVar25 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderExpand",(ulong)(uint)(iVar25 - iVar24)
                    );
              iVar23 = iVar23 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar24 = 0;
          uVar86 = 0;
          do {
            puVar90 = &DAT_00159d60;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar26 = (int)pcVar88;
              iVar25 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar26);
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              lVar77 = xmlTextReaderGetAttribute(pxVar75);
              if (lVar77 != 0) {
                (*_xmlFree)(lVar77);
              }
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar26 = xmlMemBlocks();
              if (iVar25 != iVar26) {
                iVar26 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderGetAttribute",
                       (ulong)(uint)(iVar26 - iVar25));
                iVar24 = iVar24 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar25 = 0;
          uVar86 = 0;
          do {
            puVar85 = &DAT_00157254;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar27 = (int)pcVar88;
              iVar26 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar27);
              pcVar88 = (char *)0xffffffff;
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                pcVar88 = (char *)(ulong)*puVar85;
              }
              lVar77 = xmlTextReaderGetAttributeNo(pxVar75);
              if (lVar77 != 0) {
                (*_xmlFree)(lVar77);
              }
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar27 = xmlMemBlocks();
              if (iVar26 != iVar27) {
                iVar27 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderGetAttributeNo",
                       (ulong)(uint)(iVar27 - iVar26));
                iVar25 = iVar25 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar85 = puVar85 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar26 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            do {
              pxVar76 = (xmlDocPtr)0x0;
              puVar90 = &DAT_00159d60;
              do {
                iVar28 = (int)pcVar88;
                iVar27 = xmlMemBlocks();
                pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar28);
                if (uVar92 < 4) {
                  pcVar88 = (char *)(&DAT_00159d60)[uVar92];
                }
                else {
                  pcVar88 = (char *)0x0;
                }
                uVar91 = (uint)pxVar76;
                if (uVar91 < 4) {
                  uVar74 = *puVar90;
                }
                else {
                  uVar74 = 0;
                }
                lVar77 = xmlTextReaderGetAttributeNs(pxVar75,pcVar88,uVar74);
                if (lVar77 != 0) {
                  (*_xmlFree)(lVar77);
                }
                call_tests = call_tests + 1;
                if (pxVar75 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar75);
                }
                xmlResetLastError();
                iVar28 = xmlMemBlocks();
                if (iVar27 != iVar28) {
                  iVar28 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextReaderGetAttributeNs",
                         (ulong)(uint)(iVar28 - iVar27));
                  iVar26 = iVar26 + 1;
                  printf(" %d",(ulong)uVar86);
                  printf(" %d",(ulong)uVar92);
                  printf(" %d");
                  putchar(10);
                  pcVar88 = (char *)pxVar76;
                }
                uVar91 = uVar91 + 1;
                pxVar76 = (xmlDocPtr)(ulong)uVar91;
                puVar90 = puVar90 + 1;
              } while (uVar91 != 5);
              uVar92 = uVar92 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar28 = 0;
          iVar27 = 0;
          do {
            iVar30 = (int)pcVar88;
            iVar29 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(iVar27,iVar30);
            pcVar88 = (char *)0x0;
            xmlTextReaderGetErrorHandler(pxVar75,0,0);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar30 = xmlMemBlocks();
            if (iVar29 != iVar30) {
              iVar30 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
                     (ulong)(uint)(iVar30 - iVar29));
              iVar28 = iVar28 + 1;
              printf(" %d");
              printf(" %d");
              pcVar88 = (char *)0x0;
              printf(" %d");
              putchar(10);
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar27 = 0;
          do {
            iVar29 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderGetParserColumnNumber(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar30 = xmlMemBlocks();
            if (iVar29 != iVar30) {
              iVar30 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetParserColumnNumber",
                     (ulong)(uint)(iVar30 - iVar29));
              iVar27 = iVar27 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar29 = 0;
          do {
            iVar30 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderGetParserLineNumber(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar31 = xmlMemBlocks();
            if (iVar30 != iVar31) {
              iVar31 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetParserLineNumber",
                     (ulong)(uint)(iVar31 - iVar30));
              iVar29 = iVar29 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar30 = 0;
          uVar86 = 0;
          do {
            puVar85 = &DAT_00157254;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar32 = (int)pcVar88;
              iVar31 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar32);
              pcVar88 = (char *)0xffffffff;
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                pcVar88 = (char *)(ulong)*puVar85;
              }
              xmlTextReaderGetParserProp(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar32 = xmlMemBlocks();
              if (iVar31 != iVar32) {
                iVar32 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderGetParserProp",
                       (ulong)(uint)(iVar32 - iVar31));
                iVar30 = iVar30 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar85 = puVar85 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar31 = 0;
          do {
            iVar32 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            uVar74 = xmlTextReaderGetRemainder(pxVar75);
            xmlFreeParserInputBuffer(uVar74);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar33 = xmlMemBlocks();
            if (iVar32 != iVar33) {
              iVar33 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetRemainder",
                     (ulong)(uint)(iVar33 - iVar32));
              iVar31 = iVar31 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar32 = 0;
          do {
            iVar33 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderHasAttributes(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar34 = xmlMemBlocks();
            if (iVar33 != iVar34) {
              iVar34 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderHasAttributes",
                     (ulong)(uint)(iVar34 - iVar33));
              iVar32 = iVar32 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar33 = 0;
          do {
            iVar34 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderHasValue(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar35 = xmlMemBlocks();
            if (iVar34 != iVar35) {
              iVar35 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderHasValue",
                     (ulong)(uint)(iVar35 - iVar34));
              iVar33 = iVar33 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar34 = 0;
          do {
            iVar35 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderIsDefault(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar36 = xmlMemBlocks();
            if (iVar35 != iVar36) {
              iVar36 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderIsDefault",
                     (ulong)(uint)(iVar36 - iVar35));
              iVar34 = iVar34 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar35 = 0;
          do {
            iVar36 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderIsEmptyElement(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar37 = xmlMemBlocks();
            if (iVar36 != iVar37) {
              iVar37 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderIsEmptyElement",
                     (ulong)(uint)(iVar37 - iVar36));
              iVar35 = iVar35 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar36 = 0;
          do {
            iVar37 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderIsNamespaceDecl(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar38 = xmlMemBlocks();
            if (iVar37 != iVar38) {
              iVar38 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderIsNamespaceDecl",
                     (ulong)(uint)(iVar38 - iVar37));
              iVar36 = iVar36 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar37 = 0;
          do {
            iVar38 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderIsValid(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar39 = xmlMemBlocks();
            if (iVar38 != iVar39) {
              iVar39 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderIsValid",
                     (ulong)(uint)(iVar39 - iVar38));
              iVar37 = iVar37 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar38 = 0;
          do {
            iVar39 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderLocalName(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar40 = xmlMemBlocks();
            if (iVar39 != iVar40) {
              iVar40 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderLocalName",
                     (ulong)(uint)(iVar40 - iVar39));
              iVar38 = iVar38 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar39 = xmlMemBlocks();
          lVar77 = xmlTextReaderLocatorBaseURI(0);
          if (lVar77 != 0) {
            (*_xmlFree)(lVar77);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar40 = xmlMemBlocks();
          if (iVar39 != iVar40) {
            xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderLocatorBaseURI");
            pcVar88 = (char *)0x0;
            printf(" %d");
            putchar(10);
          }
          function_tests = function_tests + 1;
          iVar41 = xmlMemBlocks();
          xmlTextReaderLocatorLineNumber(0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar42 = xmlMemBlocks();
          if (iVar41 != iVar42) {
            xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderLocatorLineNumber");
            pcVar88 = (char *)0x0;
            printf(" %d");
            putchar(10);
          }
          function_tests = function_tests + 1;
          iVar2 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            puVar90 = &DAT_00159d60;
            do {
              iVar44 = (int)pcVar88;
              iVar43 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar44);
              if (uVar92 < 4) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              lVar77 = xmlTextReaderLookupNamespace(pxVar75);
              if (lVar77 != 0) {
                (*_xmlFree)(lVar77);
              }
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar44 = xmlMemBlocks();
              if (iVar43 != iVar44) {
                iVar44 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderLookupNamespace",
                       (ulong)(uint)(iVar44 - iVar43));
                iVar2 = iVar2 + 1;
                printf(" %d",(ulong)uVar86);
                pcVar88 = (char *)(ulong)uVar92;
                printf(" %d");
                putchar(10);
              }
              uVar92 = uVar92 + 1;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar43 = 0;
          uVar86 = 0;
          do {
            puVar90 = &DAT_00159d60;
            uVar92 = 0;
            do {
              iVar45 = (int)pcVar88;
              iVar44 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar45);
              if (uVar92 < 4) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              xmlTextReaderMoveToAttribute(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar45 = xmlMemBlocks();
              if (iVar44 != iVar45) {
                iVar45 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderMoveToAttribute",
                       (ulong)(uint)(iVar45 - iVar44));
                iVar43 = iVar43 + 1;
                printf(" %d",(ulong)uVar86);
                pcVar88 = (char *)(ulong)uVar92;
                printf(" %d");
                putchar(10);
              }
              uVar92 = uVar92 + 1;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar44 = 0;
          uVar86 = 0;
          do {
            puVar85 = &DAT_00157254;
            uVar92 = 0;
            do {
              iVar46 = (int)pcVar88;
              iVar45 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar46);
              pcVar88 = (char *)0xffffffff;
              if (uVar92 < 4) {
                pcVar88 = (char *)(ulong)*puVar85;
              }
              xmlTextReaderMoveToAttributeNo(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar46 = xmlMemBlocks();
              if (iVar45 != iVar46) {
                iVar46 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNo",
                       (ulong)(uint)(iVar46 - iVar45));
                iVar44 = iVar44 + 1;
                printf(" %d",(ulong)uVar86);
                pcVar88 = (char *)(ulong)uVar92;
                printf(" %d");
                putchar(10);
              }
              uVar92 = uVar92 + 1;
              puVar85 = puVar85 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar45 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            do {
              pxVar76 = (xmlDocPtr)0x0;
              puVar90 = &DAT_00159d60;
              do {
                iVar47 = (int)pcVar88;
                iVar46 = xmlMemBlocks();
                pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar47);
                if (uVar92 < 4) {
                  pcVar88 = (char *)(&DAT_00159d60)[uVar92];
                }
                else {
                  pcVar88 = (char *)0x0;
                }
                uVar91 = (uint)pxVar76;
                if (uVar91 < 4) {
                  uVar74 = *puVar90;
                }
                else {
                  uVar74 = 0;
                }
                xmlTextReaderMoveToAttributeNs(pxVar75,pcVar88,uVar74);
                call_tests = call_tests + 1;
                if (pxVar75 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar75);
                }
                xmlResetLastError();
                iVar47 = xmlMemBlocks();
                if (iVar46 != iVar47) {
                  iVar47 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNs",
                         (ulong)(uint)(iVar47 - iVar46));
                  iVar45 = iVar45 + 1;
                  printf(" %d",(ulong)uVar86);
                  printf(" %d",(ulong)uVar92);
                  printf(" %d");
                  putchar(10);
                  pcVar88 = (char *)pxVar76;
                }
                uVar91 = uVar91 + 1;
                pxVar76 = (xmlDocPtr)(ulong)uVar91;
                puVar90 = puVar90 + 1;
              } while (uVar91 != 5);
              uVar92 = uVar92 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar46 = 0;
          do {
            iVar47 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderMoveToElement(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar48 = xmlMemBlocks();
            if (iVar47 != iVar48) {
              iVar48 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderMoveToElement",
                     (ulong)(uint)(iVar48 - iVar47));
              iVar46 = iVar46 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar47 = 0;
          do {
            iVar48 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderMoveToFirstAttribute(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar49 = xmlMemBlocks();
            if (iVar48 != iVar49) {
              iVar49 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderMoveToFirstAttribute",
                     (ulong)(uint)(iVar49 - iVar48));
              iVar47 = iVar47 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar48 = 0;
          do {
            iVar49 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderMoveToNextAttribute(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar50 = xmlMemBlocks();
            if (iVar49 != iVar50) {
              iVar50 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderMoveToNextAttribute",
                     (ulong)(uint)(iVar50 - iVar49));
              iVar48 = iVar48 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar49 = 0;
          do {
            iVar50 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderName(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar51 = xmlMemBlocks();
            if (iVar50 != iVar51) {
              iVar51 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderName",(ulong)(uint)(iVar51 - iVar50));
              iVar49 = iVar49 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar50 = 0;
          do {
            iVar51 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderNamespaceUri(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar52 = xmlMemBlocks();
            if (iVar51 != iVar52) {
              iVar52 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderNamespaceUri",
                     (ulong)(uint)(iVar52 - iVar51));
              iVar50 = iVar50 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar51 = 0;
          do {
            iVar52 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderNext(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar53 = xmlMemBlocks();
            if (iVar52 != iVar53) {
              iVar53 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderNext",(ulong)(uint)(iVar53 - iVar52));
              iVar51 = iVar51 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar52 = 0;
          do {
            iVar53 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderNextSibling(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar54 = xmlMemBlocks();
            if (iVar53 != iVar54) {
              iVar54 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderNextSibling",
                     (ulong)(uint)(iVar54 - iVar53));
              iVar52 = iVar52 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar53 = 0;
          do {
            iVar54 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderNodeType(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar55 = xmlMemBlocks();
            if (iVar54 != iVar55) {
              iVar55 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderNodeType",
                     (ulong)(uint)(iVar55 - iVar54));
              iVar53 = iVar53 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar54 = 0;
          do {
            iVar55 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderNormalization(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar56 = xmlMemBlocks();
            if (iVar55 != iVar56) {
              iVar56 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderNormalization",
                     (ulong)(uint)(iVar56 - iVar55));
              iVar54 = iVar54 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar55 = 0;
          do {
            iVar56 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderPrefix(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar57 = xmlMemBlocks();
            if (iVar56 != iVar57) {
              iVar57 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderPrefix",(ulong)(uint)(iVar57 - iVar56)
                    );
              iVar55 = iVar55 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar56 = 0;
          do {
            iVar57 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            pxVar78 = (xmlNodePtr)xmlTextReaderPreserve(pxVar75);
            desret_xmlNodePtr(pxVar78);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar58 = xmlMemBlocks();
            if (iVar57 != iVar58) {
              iVar58 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderPreserve",
                     (ulong)(uint)(iVar58 - iVar57));
              iVar56 = iVar56 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar57 = 0;
          uVar86 = 0;
          do {
            puVar90 = &DAT_00159d60;
            uVar92 = 0;
            do {
              iVar59 = (int)pcVar88;
              iVar58 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar59);
              if (uVar92 < 4) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              xmlTextReaderPreservePattern(pxVar75,pcVar88,0);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar59 = xmlMemBlocks();
              if (iVar58 != iVar59) {
                iVar59 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderPreservePattern",
                       (ulong)(uint)(iVar59 - iVar58));
                iVar57 = iVar57 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                pcVar88 = (char *)0x0;
                printf(" %d");
                putchar(10);
              }
              uVar92 = uVar92 + 1;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar58 = 0;
          do {
            iVar59 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderQuoteChar(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar60 = xmlMemBlocks();
            if (iVar59 != iVar60) {
              iVar60 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderQuoteChar",
                     (ulong)(uint)(iVar60 - iVar59));
              iVar58 = iVar58 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar59 = 0;
          do {
            iVar60 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderRead(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar61 = xmlMemBlocks();
            if (iVar60 != iVar61) {
              iVar61 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderRead",(ulong)(uint)(iVar61 - iVar60));
              iVar59 = iVar59 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar60 = 0;
          do {
            iVar61 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderReadAttributeValue(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar62 = xmlMemBlocks();
            if (iVar61 != iVar62) {
              iVar62 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderReadAttributeValue",
                     (ulong)(uint)(iVar62 - iVar61));
              iVar60 = iVar60 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar61 = 0;
          do {
            iVar62 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderReadState(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar63 = xmlMemBlocks();
            if (iVar62 != iVar63) {
              iVar63 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderReadState",
                     (ulong)(uint)(iVar63 - iVar62));
              iVar61 = iVar61 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar62 = 0;
          iVar63 = 0;
          do {
            iVar65 = (int)pcVar88;
            iVar64 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(iVar63,iVar65);
            pcVar88 = (char *)0x0;
            xmlTextReaderRelaxNGSetSchema(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar65 = xmlMemBlocks();
            if (iVar64 != iVar65) {
              iVar65 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderRelaxNGSetSchema",
                     (ulong)(uint)(iVar65 - iVar64));
              iVar62 = iVar62 + 1;
              printf(" %d");
              pcVar88 = (char *)0x0;
              printf(" %d");
              putchar(10);
            }
            iVar63 = iVar63 + 1;
          } while (iVar63 != 4);
          function_tests = function_tests + 1;
          iVar63 = 0;
          uVar86 = 0;
          do {
            puVar90 = &DAT_00159d48;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar65 = (int)pcVar88;
              iVar64 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar65);
              uVar92 = (uint)pxVar76;
              if (uVar92 < 3) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              xmlTextReaderRelaxNGValidate(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar65 = xmlMemBlocks();
              if (iVar64 != iVar65) {
                iVar65 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidate",
                       (ulong)(uint)(iVar65 - iVar64));
                iVar63 = iVar63 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar90 = puVar90 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar64 = 0;
          uVar86 = 0;
          do {
            puVar84 = &DAT_00157244;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar66 = (int)pcVar88;
              iVar65 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar66);
              uVar93 = 0x200;
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                uVar93 = *puVar84;
              }
              pcVar88 = (char *)0x0;
              xmlTextReaderRelaxNGValidateCtxt(pxVar75,0,uVar93);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar66 = xmlMemBlocks();
              if (iVar65 != iVar66) {
                iVar66 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidateCtxt",
                       (ulong)(uint)(iVar66 - iVar65));
                iVar64 = iVar64 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d",0);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar84 = puVar84 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar65 = 0;
          do {
            puVar90 = &DAT_00159d48;
            uVar86 = 0;
            do {
              pxVar75 = gen_xmlTextReaderPtr(iVar65,(int)pcVar88);
              if (uVar86 < 3) {
                pcVar88 = (char *)*puVar90;
              }
              else {
                pcVar88 = (char *)0x0;
              }
              xmlTextReaderSchemaValidate(pxVar75);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              uVar86 = uVar86 + 1;
              puVar90 = puVar90 + 1;
            } while (uVar86 != 4);
            iVar65 = iVar65 + 1;
          } while (iVar65 != 4);
          function_tests = function_tests + 1;
          iVar65 = 0;
          uVar86 = 0;
          do {
            puVar84 = &DAT_00157244;
            pxVar76 = (xmlDocPtr)0x0;
            do {
              iVar67 = (int)pcVar88;
              iVar66 = xmlMemBlocks();
              pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar67);
              uVar93 = 0x200;
              uVar92 = (uint)pxVar76;
              if (uVar92 < 4) {
                uVar93 = *puVar84;
              }
              pcVar88 = (char *)0x0;
              xmlTextReaderSchemaValidateCtxt(pxVar75,0,uVar93);
              call_tests = call_tests + 1;
              if (pxVar75 != (xmlTextReaderPtr)0x0) {
                xmlFreeTextReader(pxVar75);
              }
              xmlResetLastError();
              iVar67 = xmlMemBlocks();
              if (iVar66 != iVar67) {
                iVar67 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlTextReaderSchemaValidateCtxt",
                       (ulong)(uint)(iVar67 - iVar66));
                iVar65 = iVar65 + 1;
                printf(" %d",(ulong)uVar86);
                printf(" %d",0);
                printf(" %d");
                putchar(10);
                pcVar88 = (char *)pxVar76;
              }
              uVar92 = uVar92 + 1;
              pxVar76 = (xmlDocPtr)(ulong)uVar92;
              puVar84 = puVar84 + 1;
            } while (uVar92 != 5);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar66 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            do {
              pxVar76 = (xmlDocPtr)0x0;
              puVar84 = &DAT_00157254;
              do {
                iVar68 = (int)pcVar88;
                iVar67 = xmlMemBlocks();
                pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar68);
                uVar93 = 0xffffffff;
                pcVar88 = (char *)0xffffffff;
                if (uVar92 < 4) {
                  pcVar88 = (char *)(ulong)(uint)(&DAT_00157254)[uVar92];
                }
                uVar91 = (uint)pxVar76;
                if (uVar91 < 4) {
                  uVar93 = *puVar84;
                }
                xmlTextReaderSetParserProp(pxVar75,pcVar88,uVar93);
                call_tests = call_tests + 1;
                if (pxVar75 != (xmlTextReaderPtr)0x0) {
                  xmlFreeTextReader(pxVar75);
                }
                xmlResetLastError();
                iVar68 = xmlMemBlocks();
                if (iVar67 != iVar68) {
                  iVar68 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextReaderSetParserProp",
                         (ulong)(uint)(iVar68 - iVar67));
                  iVar66 = iVar66 + 1;
                  printf(" %d",(ulong)uVar86);
                  printf(" %d",(ulong)uVar92);
                  printf(" %d");
                  putchar(10);
                  pcVar88 = (char *)pxVar76;
                }
                uVar91 = uVar91 + 1;
                pxVar76 = (xmlDocPtr)(ulong)uVar91;
                puVar84 = puVar84 + 1;
              } while (uVar91 != 4);
              uVar92 = uVar92 + 1;
            } while (uVar92 != 4);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          iVar67 = 0;
          iVar68 = 0;
          do {
            iVar70 = (int)pcVar88;
            iVar69 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(iVar68,iVar70);
            pcVar88 = (char *)0x0;
            xmlTextReaderSetSchema(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar70 = xmlMemBlocks();
            if (iVar69 != iVar70) {
              iVar70 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderSetSchema",
                     (ulong)(uint)(iVar70 - iVar69));
              iVar67 = iVar67 + 1;
              printf(" %d");
              pcVar88 = (char *)0x0;
              printf(" %d");
              putchar(10);
            }
            iVar68 = iVar68 + 1;
          } while (iVar68 != 4);
          function_tests = function_tests + 1;
          iVar68 = 0;
          uVar86 = 0;
          do {
            uVar92 = 0;
            do {
              uVar87 = 0;
              do {
                uVar91 = 0;
                do {
                  pxVar76 = (xmlDocPtr)0x0;
                  puVar84 = &DAT_00157244;
                  do {
                    iVar70 = (int)pcVar88;
                    iVar69 = xmlMemBlocks();
                    pxVar75 = gen_xmlTextReaderPtr(uVar86,iVar70);
                    pcVar88 = (char *)gen_xmlParserInputBufferPtr(uVar92,iVar70);
                    if ((uint)uVar87 < 7) {
                      uVar74 = (&DAT_00159d80)[uVar87];
                    }
                    else {
                      uVar74 = 0;
                    }
                    if (uVar91 < 3) {
                      uVar80 = (&DAT_00159d48)[uVar91];
                    }
                    else {
                      uVar80 = 0;
                    }
                    uVar93 = 0x200;
                    uVar82 = (uint)pxVar76;
                    if (uVar82 < 4) {
                      uVar93 = *puVar84;
                    }
                    xmlTextReaderSetup(pxVar75,pcVar88,uVar74,uVar80,uVar93);
                    call_tests = call_tests + 1;
                    if (pxVar75 != (xmlTextReaderPtr)0x0) {
                      xmlFreeTextReader(pxVar75);
                    }
                    xmlResetLastError();
                    iVar70 = xmlMemBlocks();
                    if (iVar69 != iVar70) {
                      iVar70 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlTextReaderSetup",
                             (ulong)(uint)(iVar70 - iVar69));
                      iVar68 = iVar68 + 1;
                      printf(" %d",(ulong)uVar86);
                      printf(" %d",(ulong)uVar92);
                      printf(" %d",uVar87);
                      printf(" %d",(ulong)uVar91);
                      printf(" %d");
                      putchar(10);
                      pcVar88 = (char *)pxVar76;
                    }
                    uVar82 = uVar82 + 1;
                    pxVar76 = (xmlDocPtr)(ulong)uVar82;
                    puVar84 = puVar84 + 1;
                  } while (uVar82 != 5);
                  uVar91 = uVar91 + 1;
                } while (uVar91 != 4);
                uVar91 = (uint)uVar87 + 1;
                uVar87 = (ulong)uVar91;
              } while (uVar91 != 8);
              uVar92 = uVar92 + 1;
            } while (uVar92 != 8);
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          local_88 = 0;
          do {
            iVar69 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            xmlTextReaderStandalone(pxVar75);
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar70 = xmlMemBlocks();
            if (iVar69 != iVar70) {
              iVar70 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderStandalone",
                     (ulong)(uint)(iVar70 - iVar69));
              local_88 = local_88 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar69 = 0;
          do {
            iVar70 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderValue(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar71 = xmlMemBlocks();
            if (iVar70 != iVar71) {
              iVar71 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderValue",(ulong)(uint)(iVar71 - iVar70))
              ;
              iVar69 = iVar69 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = 0;
          iVar70 = 0;
          do {
            iVar71 = xmlMemBlocks();
            pxVar75 = gen_xmlTextReaderPtr(uVar86,(int)pcVar88);
            lVar77 = xmlTextReaderXmlLang(pxVar75);
            if (lVar77 != 0) {
              (*_xmlFree)(lVar77);
            }
            call_tests = call_tests + 1;
            if (pxVar75 != (xmlTextReaderPtr)0x0) {
              xmlFreeTextReader(pxVar75);
            }
            xmlResetLastError();
            iVar72 = xmlMemBlocks();
            if (iVar71 != iVar72) {
              iVar72 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderXmlLang",
                     (ulong)(uint)(iVar72 - iVar71));
              iVar70 = iVar70 + 1;
              pcVar88 = (char *)(ulong)uVar86;
              printf(" %d");
              putchar(10);
            }
            uVar86 = uVar86 + 1;
          } while (uVar86 != 4);
          function_tests = function_tests + 1;
          uVar86 = iVar1 + local_54 + local_44 + local_48 + local_64 + iVar4 + iVar5 + iVar6 + iVar7
                   + iVar8 + iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + iVar15 + iVar16 +
                   iVar17 + iVar18 + iVar19 + iVar20 + iVar21 + iVar22 + iVar23 + iVar24 + iVar25 +
                   iVar26 + iVar28 + iVar27 + iVar29 + iVar30 + iVar31 + iVar32 + iVar33 + iVar34 +
                   iVar35 + iVar36 + iVar37 + iVar38 + (uint)(iVar39 != iVar40) +
                   (uint)(iVar41 != iVar42) + iVar2 + iVar43 + iVar44 + iVar45 + iVar46 + iVar47 +
                   iVar48 + iVar49 + iVar50 + iVar51 + iVar52 + iVar53 + iVar54 + iVar55 + iVar56 +
                   iVar57 + iVar58 + iVar59 + iVar60 + iVar61 + iVar62 + iVar63 + iVar64 + iVar65 +
                   iVar66 + iVar67 + iVar68 + local_88 + iVar69 + iVar70;
          if (uVar86 != 0) {
            printf("Module xmlreader: %d errors\n",(ulong)uVar86);
          }
          return uVar86;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
test_xmlreader(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlreader : 76 of 89 functions ...\n");
    test_ret += test_xmlNewTextReader();
    test_ret += test_xmlNewTextReaderFilename();
    test_ret += test_xmlReaderForDoc();
    test_ret += test_xmlReaderForFile();
    test_ret += test_xmlReaderForMemory();
    test_ret += test_xmlReaderNewDoc();
    test_ret += test_xmlReaderNewFile();
    test_ret += test_xmlReaderNewMemory();
    test_ret += test_xmlReaderNewWalker();
    test_ret += test_xmlReaderWalker();
    test_ret += test_xmlTextReaderAttributeCount();
    test_ret += test_xmlTextReaderBaseUri();
    test_ret += test_xmlTextReaderByteConsumed();
    test_ret += test_xmlTextReaderClose();
    test_ret += test_xmlTextReaderConstBaseUri();
    test_ret += test_xmlTextReaderConstEncoding();
    test_ret += test_xmlTextReaderConstLocalName();
    test_ret += test_xmlTextReaderConstName();
    test_ret += test_xmlTextReaderConstNamespaceUri();
    test_ret += test_xmlTextReaderConstPrefix();
    test_ret += test_xmlTextReaderConstString();
    test_ret += test_xmlTextReaderConstValue();
    test_ret += test_xmlTextReaderConstXmlLang();
    test_ret += test_xmlTextReaderConstXmlVersion();
    test_ret += test_xmlTextReaderCurrentDoc();
    test_ret += test_xmlTextReaderCurrentNode();
    test_ret += test_xmlTextReaderDepth();
    test_ret += test_xmlTextReaderExpand();
    test_ret += test_xmlTextReaderGetAttribute();
    test_ret += test_xmlTextReaderGetAttributeNo();
    test_ret += test_xmlTextReaderGetAttributeNs();
    test_ret += test_xmlTextReaderGetErrorHandler();
    test_ret += test_xmlTextReaderGetLastError();
    test_ret += test_xmlTextReaderGetParserColumnNumber();
    test_ret += test_xmlTextReaderGetParserLineNumber();
    test_ret += test_xmlTextReaderGetParserProp();
    test_ret += test_xmlTextReaderGetRemainder();
    test_ret += test_xmlTextReaderHasAttributes();
    test_ret += test_xmlTextReaderHasValue();
    test_ret += test_xmlTextReaderIsDefault();
    test_ret += test_xmlTextReaderIsEmptyElement();
    test_ret += test_xmlTextReaderIsNamespaceDecl();
    test_ret += test_xmlTextReaderIsValid();
    test_ret += test_xmlTextReaderLocalName();
    test_ret += test_xmlTextReaderLocatorBaseURI();
    test_ret += test_xmlTextReaderLocatorLineNumber();
    test_ret += test_xmlTextReaderLookupNamespace();
    test_ret += test_xmlTextReaderMoveToAttribute();
    test_ret += test_xmlTextReaderMoveToAttributeNo();
    test_ret += test_xmlTextReaderMoveToAttributeNs();
    test_ret += test_xmlTextReaderMoveToElement();
    test_ret += test_xmlTextReaderMoveToFirstAttribute();
    test_ret += test_xmlTextReaderMoveToNextAttribute();
    test_ret += test_xmlTextReaderName();
    test_ret += test_xmlTextReaderNamespaceUri();
    test_ret += test_xmlTextReaderNext();
    test_ret += test_xmlTextReaderNextSibling();
    test_ret += test_xmlTextReaderNodeType();
    test_ret += test_xmlTextReaderNormalization();
    test_ret += test_xmlTextReaderPrefix();
    test_ret += test_xmlTextReaderPreserve();
    test_ret += test_xmlTextReaderPreservePattern();
    test_ret += test_xmlTextReaderQuoteChar();
    test_ret += test_xmlTextReaderRead();
    test_ret += test_xmlTextReaderReadAttributeValue();
    test_ret += test_xmlTextReaderReadState();
    test_ret += test_xmlTextReaderRelaxNGSetSchema();
    test_ret += test_xmlTextReaderRelaxNGValidate();
    test_ret += test_xmlTextReaderRelaxNGValidateCtxt();
    test_ret += test_xmlTextReaderSchemaValidate();
    test_ret += test_xmlTextReaderSchemaValidateCtxt();
    test_ret += test_xmlTextReaderSetErrorHandler();
    test_ret += test_xmlTextReaderSetMaxAmplification();
    test_ret += test_xmlTextReaderSetParserProp();
    test_ret += test_xmlTextReaderSetResourceLoader();
    test_ret += test_xmlTextReaderSetSchema();
    test_ret += test_xmlTextReaderSetStructuredErrorHandler();
    test_ret += test_xmlTextReaderSetup();
    test_ret += test_xmlTextReaderStandalone();
    test_ret += test_xmlTextReaderValue();
    test_ret += test_xmlTextReaderXmlLang();

    if (test_ret != 0)
	printf("Module xmlreader: %d errors\n", test_ret);
    return(test_ret);
}